

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

obj * o_material(obj *obj,uint material)

{
  obj *poVar1;
  obj *temp;
  obj *otmp;
  uint material_local;
  obj *obj_local;
  
  obj_local = obj;
  if ((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) != material) {
    if (obj->cobj != (obj *)0x0) {
      for (temp = obj->cobj; temp != (obj *)0x0; temp = temp->nobj) {
        if ((*(ushort *)&objects[temp->otyp].field_0x11 >> 4 & 0x1f) == material) {
          return temp;
        }
        if ((temp->cobj != (obj *)0x0) && (poVar1 = o_material(temp,material), poVar1 != (obj *)0x0)
           ) {
          return poVar1;
        }
      }
    }
    obj_local = (obj *)0x0;
  }
  return obj_local;
}

Assistant:

static struct obj *o_material(struct obj *obj, unsigned material)
{
    struct obj* otmp;
    struct obj *temp;

    if (objects[obj->otyp].oc_material == material) return obj;

    if (Has_contents(obj)) {
	for (otmp = obj->cobj; otmp; otmp = otmp->nobj)
	    if (objects[otmp->otyp].oc_material == material) return otmp;
	    else if (Has_contents(otmp) && (temp = o_material(otmp, material)))
		return temp;
    }
    return NULL;
}